

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::RenderDeviceGLImpl::CreateShader
          (RenderDeviceGLImpl *this,ShaderCreateInfo *ShaderCreateInfo,IShader **ppShader,
          IDataBlob **ppCompilerOutput)

{
  CreateShader(this,ShaderCreateInfo,ppShader,ppCompilerOutput,false);
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateShader(const ShaderCreateInfo& ShaderCreateInfo,
                                      IShader**               ppShader,
                                      IDataBlob**             ppCompilerOutput)
{
    CreateShader(ShaderCreateInfo, ppShader, ppCompilerOutput, false);
}